

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O1

void __thiscall
TPZFrontSym<double>::AddKel
          (TPZFrontSym<double> *this,TPZFMatrix<double> *elmat,TPZVec<long> *destinationindex)

{
  long lVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  lVar1 = destinationindex->fNElements;
  if (0 < lVar1) {
    lVar9 = 0;
    do {
      iVar3 = Local(this,destinationindex->fStore[lVar9]);
      lVar7 = (long)iVar3;
      lVar8 = lVar9;
      do {
        iVar3 = Local(this,destinationindex->fStore[lVar8]);
        if (((elmat->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9) ||
           ((elmat->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar8)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar4 = (long)iVar3;
        lVar5 = lVar4;
        if (lVar4 < lVar7) {
          lVar5 = lVar7;
        }
        if (lVar7 < lVar4) {
          lVar4 = lVar7;
        }
        lVar5 = (lVar5 + 1) * lVar5;
        uVar6 = lVar5 - (lVar5 >> 0x3f) & 0xfffffffffffffffe;
        pdVar2 = (this->super_TPZFront<double>).fData.fStore;
        *(double *)((long)pdVar2 + lVar4 * 8 + uVar6 * 4) =
             elmat->fElem[(elmat->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar8 + lVar9]
             + *(double *)((long)pdVar2 + lVar4 * 8 + uVar6 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 < lVar1);
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar1);
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel = destinationindex.NElements();
	for(i=0;i<nel;i++){
		ilocal = this->Local(destinationindex[i]);
		for(j=i;j<nel;j++) {
			jlocal=this->Local(destinationindex[j]);
			this->Element(ilocal, jlocal)+=elmat(i,j);
		}
	}
	/*
	 output << "Dest Index " ;
	 for(i=0;i<nel;i++) output << destinationindex[i] << " ";
	 output << endl;
	 elmat.Print("Element matrix ",output);
	 PrintGlobal("After Assemb..." , output);
	 */
}